

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

void print_attr_val_xml_encode(FILE *out,char *word)

{
  char *local_20;
  char *ptr;
  char *word_local;
  FILE *out_local;
  
  for (local_20 = word; *local_20 != '\0'; local_20 = local_20 + 1) {
    switch(*local_20) {
    case '\"':
      fputs("&quot;",(FILE *)out);
      break;
    default:
      fputc((int)*local_20,(FILE *)out);
      break;
    case '&':
      fputs("&amp;",(FILE *)out);
      break;
    case '<':
      fputs("&lt;",(FILE *)out);
      break;
    case '>':
      fputs("&gt;",(FILE *)out);
    }
  }
  return;
}

Assistant:

static void
print_attr_val_xml_encode(FILE *out, const char *word)
{
    const char *ptr;

    for (ptr = word; ptr[0]; ++ptr) {
        switch (ptr[0]) {
        case '<':
            fputs("&lt;", out);
            break;
        case '>':
            fputs("&gt;", out);
            break;
        case '&':
            fputs("&amp;", out);
            break;
        /* we always use ", so ' is fine */
        /*case '\'':
            fputs("&apos;", out);
            break;*/
        case '\"':
            fputs("&quot;", out);
            break;
        default:
            fputc(ptr[0], out);
            break;
        }
    }
}